

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall RandomBotStrategy::reinforceMaxCards(RandomBotStrategy *this,CardType param_2)

{
  bool bVar1;
  result_type_conflict rVar2;
  Hand *this_00;
  vector<CardType,_std::allocator<CardType>_> *this_01;
  reference pCVar3;
  uniform_int_distribution<int> local_3c;
  uniform_int_distribution<int> dis;
  CardType currentCard;
  iterator __end1;
  iterator __begin1;
  vector<CardType,_std::allocator<CardType>_> *__range1;
  int numberCurrentType;
  int currentType_local;
  RandomBotStrategy *this_local;
  
  __range1._0_4_ = 0;
  this_00 = Player::getCards((this->super_PlayerStrategy).player);
  this_01 = Hand::getHand(this_00);
  __end1 = std::vector<CardType,_std::allocator<CardType>_>::begin(this_01);
  register0x00000000 = std::vector<CardType,_std::allocator<CardType>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>
                                *)&dis._M_param._M_b);
    if (!bVar1) break;
    pCVar3 = __gnu_cxx::
             __normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>::
             operator*(&__end1);
    dis._M_param._M_a = *pCVar3;
    if (dis._M_param._M_a == param_2) {
      __range1._0_4_ = (int)__range1 + 1;
    }
    __gnu_cxx::__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>::
    operator++(&__end1);
  }
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_3c,0,(int)__range1);
  rVar2 = std::uniform_int_distribution<int>::operator()
                    (&local_3c,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)&stack0x00000008);
  return rVar2;
}

Assistant:

int RandomBotStrategy::reinforceMaxCards(std::mt19937 gen, int currentType) {
    int numberCurrentType = 0;
    for (CardType currentCard : *player->getCards()->getHand()) {
        if (currentCard == currentType) {
            numberCurrentType++;
        }
    }
    std::uniform_int_distribution<> dis(0, numberCurrentType);
    return dis(gen);
}